

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

TupleMake * __thiscall
wasm::Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *operands)

{
  TupleMake *pTVar1;
  TupleMake *ret;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *operands_local;
  Builder *this_local;
  
  pTVar1 = MixedArena::alloc<wasm::TupleMake>((MixedArena *)(this->wasm + 0x200));
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pTVar1->operands,
             operands);
  wasm::TupleMake::finalize();
  return pTVar1;
}

Assistant:

TupleMake* makeTupleMake(ListType&& operands) {
    auto* ret = wasm.allocator.alloc<TupleMake>();
    ret->operands.set(operands);
    ret->finalize();
    return ret;
  }